

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

void av1_setup_frame_size(AV1_COMP *cpi)

{
  long in_RDI;
  size_params_type sVar1;
  size_params_type rsz;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  *(undefined1 *)(in_RDI + 0x3bfd0) = 8;
  sVar1 = calculate_next_size_params((AV1_COMP *)(in_RDI + 0x3bf80));
  setup_frame_size_from_params
            ((AV1_COMP *)CONCAT44(sVar1.resize_width,in_stack_ffffffffffffffe0),
             (size_params_type *)
             CONCAT44(in_stack_ffffffffffffffdc,
                      CONCAT31((int3)((uint)in_stack_ffffffffffffffd8 >> 8),sVar1.superres_denom)));
  return;
}

Assistant:

void av1_setup_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  // Reset superres params from previous frame.
  cm->superres_scale_denominator = SCALE_NUMERATOR;
  const size_params_type rsz = calculate_next_size_params(cpi);
  setup_frame_size_from_params(cpi, &rsz);

  assert(av1_is_min_tile_width_satisfied(cm));
}